

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePickerPrivate::updateCurrentDateTime(DateTimePickerPrivate *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  Section *pSVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  undefined8 local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  ulong local_50;
  QDateTime *local_48;
  QTime local_3c;
  QDate local_38;
  
  local_68 = QDateTime::date();
  iVar2 = QDate::year();
  local_68 = QDateTime::date();
  iVar3 = QDate::month();
  uVar4 = QDateTime::time();
  local_68._0_4_ = uVar4;
  uVar5 = QTime::hour();
  local_68._0_4_ = QDateTime::time();
  local_54 = QTime::minute();
  local_68._0_4_ = QDateTime::time();
  local_58 = QTime::second();
  uVar4 = QDateTime::time();
  local_68 = CONCAT44(local_68._4_4_,uVar4);
  iVar6 = QTime::msec();
  lVar7 = (this->super_DateTimeParser).sections.d.size;
  if (lVar7 < 1) {
    iVar8 = 1;
  }
  else {
    local_48 = &this->minimum;
    pSVar9 = (this->super_DateTimeParser).sections.d.ptr;
    local_5c = -1;
    lVar11 = 0x28;
    lVar10 = 0;
    iVar12 = -1;
    local_60 = iVar6;
    local_50 = (ulong)uVar5;
    do {
      iVar6 = *(int *)((long)pSVar9 + lVar11 + -0x28);
      if (iVar6 < 0x80) {
        if (iVar6 < 0x10) {
          switch(iVar6) {
          case 1:
            local_5c = *(int *)((long)&pSVar9->type + lVar11);
            break;
          case 2:
            local_58 = *(int *)((long)&pSVar9->type + lVar11);
            break;
          case 4:
            local_54 = *(int *)((long)&pSVar9->type + lVar11);
            break;
          case 8:
switchD_0015a787_caseD_8:
            local_50 = (ulong)*(uint *)((long)&pSVar9->type + lVar11);
          }
        }
        else {
          if (iVar6 == 0x10) goto switchD_0015a787_caseD_8;
          if ((iVar6 == 0x20) || (iVar6 == 0x40)) goto LAB_0015a7ca;
        }
      }
      else if (iVar6 < 0x400) {
        if (iVar6 == 0x80) {
LAB_0015a7ca:
          iVar12 = *(int *)((long)&pSVar9->type + lVar11) + 1;
        }
        else if ((iVar6 == 0x100) || (iVar6 == 0x200)) goto LAB_0015a817;
      }
      else if (iVar6 == 0x400) {
LAB_0015a817:
        iVar3 = *(int *)((long)&pSVar9->type + lVar11) + 1;
      }
      else if ((iVar6 == 0x800) || (iVar6 == 0x1000)) {
        local_68 = QDateTime::date();
        iVar2 = QDate::year();
        pSVar9 = (this->super_DateTimeParser).sections.d.ptr;
        iVar2 = iVar2 + *(int *)((long)&pSVar9->type + lVar11);
        lVar7 = (this->super_DateTimeParser).sections.d.size;
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x30;
    } while (lVar10 < lVar7);
    iVar8 = 1;
    if (iVar12 != -1) {
      iVar8 = iVar12;
    }
    uVar1 = (uint)local_50;
    iVar6 = local_60;
    if (local_5c == 0) {
      uVar5 = 0;
      if (uVar1 != 0xb) {
        uVar5 = uVar1 + 1;
      }
    }
    else {
      uVar5 = uVar1;
      if (local_5c == 1) {
        uVar5 = 0xc;
        if (uVar1 != 0xb) {
          uVar5 = uVar1 + 0xd;
        }
      }
    }
  }
  QDate::QDate(&local_38,iVar2,iVar3,iVar8);
  QTime::QTime(&local_3c,uVar5,local_54,local_58,iVar6);
  QDateTime::QDateTime((QDateTime *)&local_68,local_38,local_3c,this->spec,0);
  setValue(this,(QDateTime *)&local_68,false);
  QDateTime::~QDateTime((QDateTime *)&local_68);
  return;
}

Assistant:

void
DateTimePickerPrivate::updateCurrentDateTime()
{
	int year = value.date().year();
	int month = value.date().month();
	int day = -1;
	int hour = value.time().hour();
	int minute = value.time().minute();
	int second = value.time().second();
	int msecs = value.time().msec();
	int amPm = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		switch( sections.at( i ).type )
		{
			case Section::AmPmSection :
			{
				amPm = sections.at( i ).currentIndex;
			}
			break;

			case Section::SecondSection :
			{
				second = sections.at( i ).currentIndex;
			}
			break;

			case Section::MinuteSection :
			{
				minute = sections.at( i ).currentIndex;
			}
			break;

			case Section::Hour12Section :
			case Section::Hour24Section :
			{
				hour = sections.at( i ).currentIndex;
			}
			break;

			case Section::DaySection :
			case Section::DaySectionShort :
			case Section::DaySectionLong :
			{
				day = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::MonthSection :
			case Section::MonthSectionShort :
			case Section::MonthSectionLong :
			{
				month = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::YearSection :
			case Section::YearSection2Digits :
			{
				year = minimum.date().year() + sections.at( i ).currentIndex;
			}
			break;

			default:
				break;
		}
	}

	if( day == -1 )
		day = 1;

	if( amPm == 0 )
	{
		if( hour == 11 )
			hour = 0;
		else
			hour += 1;
	}
	else if( amPm == 1 )
	{
		if( hour == 11 )
			hour = 12;
		else
			hour += 12 + 1;
	}

	setValue( QDateTime( QDate( year, month, day ),
		QTime( hour, minute, second, msecs ), spec ), false );
}